

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O0

int rbcholu(double *A,int N,int stride,double *UB,double *UT)

{
  int rows;
  void *__ptr;
  void *__ptr_00;
  double *sig;
  double *col;
  int iVar1;
  double local_88;
  double sum;
  double *U12T;
  double *U12;
  double *x;
  double *b;
  int sc;
  int w;
  int v;
  int u;
  int k;
  int t;
  int Nb;
  int j;
  int i;
  int bb;
  int bs;
  double *UT_local;
  double *UB_local;
  int stride_local;
  int N_local;
  double *A_local;
  
  if (N < 0x41) {
    b._4_4_ = rcholu(A,N,stride,UB);
    if (b._4_4_ == -1) {
      return -1;
    }
  }
  else {
    rows = N + -0x40;
    __ptr = malloc(0x200);
    __ptr_00 = malloc(0x200);
    sig = (double *)malloc((long)rows << 9);
    col = (double *)malloc((long)rows << 9);
    rcholu(A,0x40,stride,UB);
    for (Nb = 0; Nb < 0x40; Nb = Nb + 1) {
      w = 0;
      for (t = 0; t < N; t = t + 1) {
        UT[w + Nb] = A[t + Nb * stride];
        w = w + 0x40;
      }
    }
    for (v = 0; v < rows; v = v + 1) {
      for (Nb = 0; Nb < 0x40; Nb = Nb + 1) {
        *(double *)((long)__ptr_00 + (long)Nb * 8) = UT[v * 0x40 + 0x1000 + Nb];
        *(undefined8 *)((long)__ptr + (long)Nb * 8) = 0;
      }
      for (Nb = 0; Nb < 0x40; Nb = Nb + 1) {
        local_88 = 0.0;
        for (t = 0; t < Nb; t = t + 1) {
          local_88 = UT[Nb * 0x40 + t] * *(double *)((long)__ptr + (long)t * 8) + local_88;
        }
        *(double *)((long)__ptr + (long)Nb * 8) =
             (*(double *)((long)__ptr_00 + (long)Nb * 8) - local_88) / UT[Nb * 0x41];
      }
      sc = v + 0x40;
      for (Nb = 0; Nb < 0x40; Nb = Nb + 1) {
        A[sc] = *(double *)((long)__ptr + (long)Nb * 8);
        sig[v * 0x40 + Nb] = *(double *)((long)__ptr + (long)Nb * 8);
        sc = stride + sc;
      }
    }
    mtranspose(sig,rows,0x40,col);
    mmult(sig,col,UT,rows,0x40,rows);
    free(sig);
    free(col);
    free(__ptr_00);
    free(__ptr);
    for (Nb = 0; Nb < rows; Nb = Nb + 1) {
      for (t = Nb; t < rows; t = t + 1) {
        iVar1 = t + stride * 0x40 + 0x40 + Nb * stride;
        A[iVar1] = A[iVar1] - UT[t + Nb * rows];
      }
    }
    b._4_4_ = rbcholu(A + (long)(stride * 0x40) + 0x40,rows,stride,UB,UT);
    if (b._4_4_ == -1) {
      return -1;
    }
  }
  return b._4_4_;
}

Assistant:

static int rbcholu(double *A,int N, int stride, double *UB, double *UT) {
	int bs,bb,i,j,Nb,t,k,u,v,w,sc;
	double *b,*x,*U12,*U12T;
	double sum;
	
	bs = (int) BLOCKSIZE;
	bb = bs*bs;
	
	if (N <= BLOCKSIZE) {
		sc = rcholu(A,N,stride,UB);
		if (sc == -1) {
			return -1;
		}
	} else {
		Nb = N - bs;
		x = (double*) malloc(sizeof(double) * bs);
		b = (double*) malloc(sizeof(double) * bs);
		U12T = (double*) malloc(sizeof(double) * Nb * bs);
		U12 = (double*) malloc(sizeof(double) * Nb * bs);
		rcholu(A,bs,stride,UB); // U11
		
		for (i =0; i < bs;++i) {
			t = i *stride;
			u = 0;
			for(j = 0; j < N;++j) {
				UT[u+i] = A[j+t];
				u += bs;
			}
		}
		
		for(k = 0; k < Nb;++k) {
			u = k * bs;
			for(i = 0; i < bs;++i) {
				b[i] = UT[bb+u+i];
				x[i] = 0.;
			}
			for (i = 0; i < bs;++i) {
				t = i*bs;
				sum = 0;
				for (j = 0; j < i;++j) {
					sum += UT[t+j] * x[j];
				}
				x[i] = (b[i] - sum) / UT[t+i];
			}
			v = bs + k;
			for(i = 0; i < bs;++i) {
				A[v] = x[i];
				U12T[u+i] = x[i];
				v += stride;
			}
		}
		
		mtranspose(U12T,Nb,bs,U12);
		mmult(U12T,U12,UT,Nb,bs,Nb);
		free(U12T);
		free(U12);
		free(b);
		free(x);
		for (i = 0; i < Nb; ++i) {
			u = bs * stride + bs + i * stride;
			w = i * Nb;
			for(j = i; j < Nb;j++) {
				A[j + u] -= UT[j + w];
			}
		}
		
		sc = rbcholu(A + bs * stride + bs,Nb,stride,UB,UT);
		if (sc == -1) {
			return -1;
		}
	}
	
	return sc;
}